

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackGenerator::InstallProjectViaInstallCommands
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  reference pbVar5;
  string local_6d0 [32];
  undefined1 local_6b0 [8];
  ostringstream cmCPackLog_msg_1;
  undefined1 local_538 [8];
  cmGeneratedFileStream ofs;
  string local_2e8;
  string local_2c8 [8];
  string tmpFile;
  undefined1 local_2a0 [3];
  bool resB;
  int retVal;
  string output;
  undefined1 local_260 [8];
  ostringstream cmCPackLog_msg;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  iterator it;
  string local_c8;
  undefined1 local_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installCommandsVector;
  undefined1 local_88 [8];
  string tempInstallDirectoryEnv;
  allocator local_51;
  string local_50;
  char *local_30;
  char *installCommands;
  string *tempInstallDirectory_local;
  cmCPackGenerator *pcStack_18;
  bool setDestDir_local;
  cmCPackGenerator *this_local;
  
  installCommands = (char *)tempInstallDirectory;
  tempInstallDirectory_local._7_1_ = setDestDir;
  pcStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"CPACK_INSTALL_COMMANDS",&local_51);
  pcVar3 = GetOption(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
    local_30 = pcVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_88,"CMAKE_INSTALL_PREFIX=",
               (allocator *)
               ((long)&installCommandsVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&installCommandsVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::operator+=((string *)local_88,(string *)installCommands);
    cmsys::SystemTools::PutEnv((string *)local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8);
    pcVar3 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,pcVar3,(allocator *)((long)&it._M_current + 7))
    ;
    cmSystemTools::ExpandListArgument
              (&local_c8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8,false);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::__normal_iterator(&local_d8);
    local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_a8);
    local_d8._M_current = local_e0;
    while( true ) {
      local_e8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
      bVar2 = __gnu_cxx::operator!=(&local_d8,&local_e8);
      if (!bVar2) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
      poVar4 = std::operator<<((ostream *)local_260,"Execute: ");
      pbVar5 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_d8);
      poVar4 = std::operator<<(poVar4,(string *)pbVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x122,pcVar3);
      std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
      std::__cxx11::string::string((string *)local_2a0);
      tmpFile.field_2._12_4_ = 1;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_d8);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      tmpFile.field_2._M_local_buf[0xb] =
           cmSystemTools::RunSingleCommand
                     (pcVar3,(string *)local_2a0,(string *)local_2a0,
                      (int *)(tmpFile.field_2._M_local_buf + 0xc),(char *)0x0,this->GeneratorVerbose
                      ,0.0);
      if (((bool)tmpFile.field_2._M_local_buf[0xb]) && (tmpFile.field_2._12_4_ == 0)) {
        bVar2 = false;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_2e8,"CPACK_TOPLEVEL_DIRECTORY",(allocator *)&ofs.field_0x247);
        pcVar3 = GetOption(this,&local_2e8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2c8,pcVar3,(allocator *)&ofs.field_0x246);
        std::allocator<char>::~allocator((allocator<char> *)&ofs.field_0x246);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::allocator<char>::~allocator((allocator<char> *)&ofs.field_0x247);
        std::__cxx11::string::operator+=(local_2c8,"/InstallOutput.log");
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)local_538,pcVar3,false);
        poVar4 = std::operator<<((ostream *)local_538,"# Run command: ");
        pbVar5 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_d8);
        poVar4 = std::operator<<(poVar4,(string *)pbVar5);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,"# Output:");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,(string *)local_2a0);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b0);
        poVar4 = std::operator<<((ostream *)local_6b0,"Problem running install command: ");
        pbVar5 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_d8);
        poVar4 = std::operator<<(poVar4,(string *)pbVar5);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,"Please check ");
        poVar4 = std::operator<<(poVar4,local_2c8);
        poVar4 = std::operator<<(poVar4," for errors");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x133,pcVar3);
        std::__cxx11::string::~string(local_6d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b0);
        this_local._4_4_ = 0;
        bVar2 = true;
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_538);
        std::__cxx11::string::~string(local_2c8);
      }
      std::__cxx11::string::~string((string *)local_2a0);
      if (bVar2) goto LAB_004706f1;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_d8);
    }
    bVar2 = false;
LAB_004706f1:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8);
    std::__cxx11::string::~string((string *)local_88);
    if (bVar2) {
      return this_local._4_4_;
    }
  }
  return 1;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstallCommands(
  bool setDestDir, const std::string& tempInstallDirectory)
{
  (void) setDestDir;
  const char* installCommands = this->GetOption("CPACK_INSTALL_COMMANDS");
  if ( installCommands && *installCommands )
    {
    std::string tempInstallDirectoryEnv = "CMAKE_INSTALL_PREFIX=";
    tempInstallDirectoryEnv += tempInstallDirectory;
    cmSystemTools::PutEnv(tempInstallDirectoryEnv);
    std::vector<std::string> installCommandsVector;
    cmSystemTools::ExpandListArgument(installCommands,installCommandsVector);
    std::vector<std::string>::iterator it;
    for ( it = installCommandsVector.begin();
      it != installCommandsVector.end();
      ++it )
      {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << *it
        << std::endl);
      std::string output;
      int retVal = 1;
      bool resB = cmSystemTools::RunSingleCommand(
        it->c_str(), &output, &output,
        &retVal, 0, this->GeneratorVerbose, 0);
      if ( !resB || retVal )
        {
        std::string tmpFile = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
        tmpFile += "/InstallOutput.log";
        cmGeneratedFileStream ofs(tmpFile.c_str());
        ofs << "# Run command: " << *it << std::endl
          << "# Output:" << std::endl
          << output << std::endl;
        cmCPackLogger(cmCPackLog::LOG_ERROR,
          "Problem running install command: " << *it << std::endl
          << "Please check " << tmpFile << " for errors"
          << std::endl);
        return 0;
        }
      }
    }
  return 1;
}